

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::TriangleInterpolationTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TriangleInterpolationTestInstance *this)

{
  pointer *this_00;
  pointer *this_01;
  deUint32 width;
  bool bVar1;
  int iVar2;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  size_type sVar6;
  reference pvVar7;
  TextureFormat *format;
  int *piVar8;
  allocator<char> local_511;
  string local_510;
  undefined4 local_4f0;
  allocator<char> local_4e9;
  string local_4e8;
  undefined1 local_4c8 [8];
  IVec4 colorBits;
  TriangleSceneSpec scene;
  RasterizationArguments args;
  int local_304;
  undefined1 local_300 [4];
  int vtxNdx;
  undefined1 local_180 [8];
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  triangles;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ScopedLogSection local_d8;
  ScopedLogSection section;
  int local_9c;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string iterationDescription;
  TriangleInterpolationTestInstance *this_local;
  
  local_9c = this->m_iteration + 1;
  iterationDescription.field_2._8_8_ = this;
  de::toString<int>(&local_98,&local_9c);
  std::operator+(&local_78,"Test iteration ",&local_98);
  std::operator+(&local_58,&local_78," / ");
  de::toString<int>((string *)&section,&this->m_iterationCount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  pTVar3 = Context::getTestContext
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  pTVar4 = tcu::TestContext::getLog(pTVar3);
  resultImage.m_pixels.m_cap._4_4_ = this->m_iteration + 1;
  de::toString<int>(&local_118,(int *)((long)&resultImage.m_pixels.m_cap + 4));
  std::operator+(&local_f8,"Iteration",&local_118);
  tcu::ScopedLogSection::ScopedLogSection(&local_d8,pTVar4,&local_f8,(string *)local_38);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,width,width);
  this_00 = &colorBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)this_00);
  this_01 = &triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)this_01);
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::vector((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            *)local_180);
  generateVertices(this,this->m_iteration,
                   (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)this_00
                   ,(vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                    this_01);
  extractTriangles(this,(vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                         *)local_180,
                   (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   &colorBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   &triangles.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar3 = Context::getTestContext
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  pTVar4 = tcu::TestContext::getLog(pTVar3);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_300,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_300,(char (*) [20])"Generated vertices:");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_300);
  local_304 = 0;
  while( true ) {
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &colorBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((int)sVar6 <= local_304) break;
    pTVar3 = Context::getTestContext
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&args.greenBits,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message)
    ;
    pMVar5 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&args.greenBits,(char (*) [2])0x12f6f82);
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &colorBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_304);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar7);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [10])",\tcolor= ");
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &triangles.
                         super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_304);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar7);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&args.greenBits);
    local_304 = local_304 + 1;
  }
  BaseRenderingTestInstance::drawPrimitives
            (&this->super_BaseRenderingTestInstance,
             (Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this->m_primitiveTopology);
  tcu::TriangleSceneSpec::TriangleSceneSpec((TriangleSceneSpec *)(colorBits.m_data + 2));
  format = BaseRenderingTestInstance::getTextureFormat(&this->super_BaseRenderingTestInstance);
  tcu::getTextureFormatBitDepth((tcu *)local_4c8,format);
  scene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       (uint)((this->super_BaseRenderingTestInstance).m_multisampling != 0);
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_4c8,0);
  args.numSamples = *piVar8;
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_4c8,1);
  args.subpixelBits = *piVar8;
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_4c8,2);
  args.redBits = *piVar8;
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::swap((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          *)(colorBits.m_data + 2),
         (vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          *)local_180);
  pTVar3 = Context::getTestContext
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  pTVar4 = tcu::TestContext::getLog(pTVar3);
  bVar1 = tcu::verifyTriangleGroupInterpolation
                    ((Surface *)
                     &drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (TriangleSceneSpec *)(colorBits.m_data + 2),
                     (RasterizationArguments *)
                     ((long)&scene.triangles.
                             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),pTVar4);
  if (!bVar1) {
    this->m_allIterationsPassed = false;
  }
  tcu::TriangleSceneSpec::~TriangleSceneSpec((TriangleSceneSpec *)(colorBits.m_data + 2));
  iVar2 = this->m_iteration + 1;
  this->m_iteration = iVar2;
  if (iVar2 == this->m_iterationCount) {
    if ((this->m_allIterationsPassed & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"Found invalid pixel values",&local_511);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator(&local_511);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"Pass",&local_4e9);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_4e8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::allocator<char>::~allocator(&local_4e9);
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
  local_4f0 = 1;
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~vector((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             *)local_180);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Surface::~Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::ScopedLogSection::~ScopedLogSection(&local_d8);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TriangleInterpolationTestInstance::iterate (void)
{
	const std::string								iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection						section					(m_context.getTestContext().getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	tcu::Surface									resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<tcu::Vec4>							colorBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(m_iteration, drawBuffer, colorBuffer);
	extractTriangles(triangles, drawBuffer, colorBuffer);

	// log
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
		for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
	}

	// draw image
	drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitiveTopology);

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;
		tcu::IVec4				colorBits	= tcu::getTextureFormatBitDepth(getTextureFormat());

		args.numSamples		= m_multisampling ? 1 : 0;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= colorBits[0];
		args.greenBits		= colorBits[1];
		args.blueBits		= colorBits[2];

		scene.triangles.swap(triangles);

		if (!verifyTriangleGroupInterpolation(resultImage, scene, args, m_context.getTestContext().getLog()))
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Found invalid pixel values");
	}
	else
		return tcu::TestStatus::incomplete();
}